

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::WaitForSinks(LogMessageData *data)

{
  bool bVar1;
  pointer this;
  type this_00;
  reference ppLVar2;
  bool send_to_sink;
  size_type local_28;
  size_t i;
  shared_lock<std::shared_mutex> l;
  LogMessageData *data_local;
  
  l._8_8_ = data;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)&i,(mutex_type *)sink_mutex_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&sinks_);
  if (bVar1) {
    this = std::
           unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
           ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                         *)&sinks_);
    local_28 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::size(this);
    while (local_28 != 0) {
      this_00 = std::
                unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                ::operator*((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                             *)&sinks_);
      ppLVar2 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                          (this_00,local_28 - 1);
      (*(*ppLVar2)->_vptr_LogSink[4])();
      local_28 = local_28 - 1;
    }
  }
  bVar1 = true;
  if (*(code **)(l._8_8_ + 0x76a0) != LogMessage::SendToSink ||
      *(code **)(l._8_8_ + 0x76a0) != (code *)0x0 && *(long *)(l._8_8_ + 0x76a8) != 0) {
    bVar1 = *(code **)(l._8_8_ + 0x76a0) == LogMessage::SendToSinkAndLog &&
            (*(code **)(l._8_8_ + 0x76a0) == (code *)0x0 || *(long *)(l._8_8_ + 0x76a8) == 0);
  }
  if ((bVar1) && (*(long *)(l._8_8_ + 0x76b0) != 0)) {
    (**(code **)(**(long **)(l._8_8_ + 0x76b0) + 0x20))();
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&i);
  return;
}

Assistant:

inline void LogDestination::WaitForSinks(LogMessage::LogMessageData* data) {
  std::shared_lock<SinkMutex> l{sink_mutex_};
  if (sinks_) {
    for (size_t i = sinks_->size(); i-- > 0;) {
      (*sinks_)[i]->WaitTillSent();
    }
  }
  const bool send_to_sink =
      (data->send_method_ == &LogMessage::SendToSink) ||
      (data->send_method_ == &LogMessage::SendToSinkAndLog);
  if (send_to_sink && data->sink_ != nullptr) {
    data->sink_->WaitTillSent();
  }
}